

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int count,float items_height)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  
  pIVar2 = GImGui->CurrentWindow;
  this->StartPosY = ((pIVar2->DC).CursorPos.y - (pIVar2->Pos).y) + (pIVar2->Scroll).y;
  this->ItemsHeight = items_height;
  this->ItemsCount = count;
  this->StepNo = 0;
  this->DisplayStart = -1;
  this->DisplayEnd = -1;
  if (0.0 < items_height) {
    ImGui::CalcListClipping(count,items_height,&this->DisplayStart,&this->DisplayEnd);
    iVar1 = this->DisplayStart;
    if (0 < iVar1) {
      SetCursorPosYAndSetupDummyPrevLine
                ((float)iVar1 * this->ItemsHeight + this->StartPosY,this->ItemsHeight);
    }
    this->StepNo = 2;
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }